

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CreateForeignKey(Parse *pParse,ExprList *pFromCol,Token *pTo,ExprList *pToCol,int flags)

{
  sqlite3 *db;
  Table *pTVar1;
  char *z;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FKey *data;
  FKey *pFVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  sColMap *z_00;
  undefined1 *puVar10;
  undefined1 *__dest;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  
  db = pParse->db;
  pTVar1 = pParse->pNewTable;
  if ((pTVar1 != (Table *)0x0) && (pParse->declareVtab == '\0')) {
    if (pFromCol == (ExprList *)0x0) {
      if (0 < pTVar1->nCol) {
        uVar7 = 1;
        if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == 1)) goto LAB_0013e13a;
        sqlite3ErrorMsg(pParse,"foreign key on %s should reference only one column of table %T",
                        pTVar1->aCol[(ushort)pTVar1->nCol - 1].zName,pTo);
      }
    }
    else {
      uVar7 = (ulong)(uint)pFromCol->nExpr;
      if ((pToCol == (ExprList *)0x0) || (pToCol->nExpr == pFromCol->nExpr)) {
LAB_0013e13a:
        iVar2 = (int)uVar7;
        iVar12 = iVar2 * 0x10 + pTo->n + 0x41;
        if (pToCol != (ExprList *)0x0) {
          uVar9 = 0;
          uVar11 = (ulong)(uint)pToCol->nExpr;
          if (pToCol->nExpr < 1) {
            uVar11 = uVar9;
          }
          for (; uVar11 * 0x20 != uVar9; uVar9 = uVar9 + 0x20) {
            iVar3 = sqlite3Strlen30(*(char **)((long)&pToCol->a->zName + uVar9));
            iVar12 = iVar12 + iVar3 + 1;
          }
        }
        data = (FKey *)sqlite3DbMallocZero(db,(long)iVar12);
        if (data != (FKey *)0x0) {
          data->pFrom = pTVar1;
          data->pNextFrom = pTVar1->pFKey;
          z_00 = data->aCol + iVar2;
          data->zTo = (char *)z_00;
          memcpy(z_00,pTo->z,(ulong)pTo->n);
          *(undefined1 *)((long)&z_00->iFrom + (ulong)pTo->n) = 0;
          sqlite3Dequote((char *)z_00);
          uVar5 = pTo->n;
          data->nCol = iVar2;
          if (pFromCol == (ExprList *)0x0) {
            data->aCol[0].iFrom = pTVar1->nCol + -1;
          }
          else {
            uVar11 = 0;
            if (0 < iVar2) {
              uVar11 = uVar7;
            }
            for (uVar9 = 0; uVar9 != uVar11; uVar9 = uVar9 + 1) {
              uVar4 = (uint)(ushort)pTVar1->nCol;
              if (pTVar1->nCol < 1) {
                uVar4 = 0;
              }
              lVar8 = 0;
              uVar13 = 0;
              while( true ) {
                if (uVar4 == uVar13) {
                  sqlite3ErrorMsg(pParse,"unknown column \"%s\" in foreign key definition",
                                  pFromCol->a[uVar9 & 0xffffffff].zName);
                  goto LAB_0013e0cc;
                }
                iVar12 = sqlite3_stricmp(*(char **)((long)&pTVar1->aCol->zName + lVar8),
                                         pFromCol->a[uVar9].zName);
                if (iVar12 == 0) break;
                uVar13 = uVar13 + 1;
                lVar8 = lVar8 + 0x30;
              }
              data->aCol[uVar9].iFrom = (int)uVar13;
            }
          }
          if (pToCol != (ExprList *)0x0) {
            __dest = (undefined1 *)((long)&z_00->iFrom + (ulong)(uVar5 + 1));
            uVar11 = 0;
            if (iVar2 < 1) {
              uVar7 = uVar11;
            }
            for (; uVar7 << 4 != uVar11; uVar11 = uVar11 + 0x10) {
              z = *(char **)((long)&pToCol->a->zName + uVar11 * 2);
              uVar5 = sqlite3Strlen30(z);
              *(undefined1 **)((long)&data->aCol[0].zCol + uVar11) = __dest;
              memcpy(__dest,z,(ulong)uVar5);
              puVar10 = __dest + uVar5;
              __dest = puVar10 + 1;
              *puVar10 = 0;
            }
          }
          data->isDeferred = '\0';
          data->aAction[0] = (u8)flags;
          data->aAction[1] = (u8)((uint)flags >> 8);
          pFVar6 = (FKey *)sqlite3HashInsert(&pTVar1->pSchema->fkeyHash,data->zTo,data);
          if (pFVar6 == data) {
            db->mallocFailed = '\x01';
          }
          else {
            if (pFVar6 != (FKey *)0x0) {
              data->pNextTo = pFVar6;
              pFVar6->pPrevTo = data;
            }
            pTVar1->pFKey = data;
            data = (FKey *)0x0;
          }
          goto LAB_0013e0cc;
        }
      }
      else {
        sqlite3ErrorMsg(pParse,
                        "number of columns in foreign key does not match the number of columns in the referenced table"
                       );
      }
    }
  }
  data = (FKey *)0x0;
LAB_0013e0cc:
  sqlite3DbFree(db,data);
  sqlite3ExprListDelete(db,pFromCol);
  sqlite3ExprListDelete(db,pToCol);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CreateForeignKey(
  Parse *pParse,       /* Parsing context */
  ExprList *pFromCol,  /* Columns in this table that point to other table */
  Token *pTo,          /* Name of the other table */
  ExprList *pToCol,    /* Columns in the other table */
  int flags            /* Conflict resolution algorithms. */
){
  sqlite3 *db = pParse->db;
#ifndef SQLITE_OMIT_FOREIGN_KEY
  FKey *pFKey = 0;
  FKey *pNextTo;
  Table *p = pParse->pNewTable;
  int nByte;
  int i;
  int nCol;
  char *z;

  assert( pTo!=0 );
  if( p==0 || IN_DECLARE_VTAB ) goto fk_end;
  if( pFromCol==0 ){
    int iCol = p->nCol-1;
    if( NEVER(iCol<0) ) goto fk_end;
    if( pToCol && pToCol->nExpr!=1 ){
      sqlite3ErrorMsg(pParse, "foreign key on %s"
         " should reference only one column of table %T",
         p->aCol[iCol].zName, pTo);
      goto fk_end;
    }
    nCol = 1;
  }else if( pToCol && pToCol->nExpr!=pFromCol->nExpr ){
    sqlite3ErrorMsg(pParse,
        "number of columns in foreign key does not match the number of "
        "columns in the referenced table");
    goto fk_end;
  }else{
    nCol = pFromCol->nExpr;
  }
  nByte = sizeof(*pFKey) + (nCol-1)*sizeof(pFKey->aCol[0]) + pTo->n + 1;
  if( pToCol ){
    for(i=0; i<pToCol->nExpr; i++){
      nByte += sqlite3Strlen30(pToCol->a[i].zName) + 1;
    }
  }
  pFKey = sqlite3DbMallocZero(db, nByte );
  if( pFKey==0 ){
    goto fk_end;
  }
  pFKey->pFrom = p;
  pFKey->pNextFrom = p->pFKey;
  z = (char*)&pFKey->aCol[nCol];
  pFKey->zTo = z;
  memcpy(z, pTo->z, pTo->n);
  z[pTo->n] = 0;
  sqlite3Dequote(z);
  z += pTo->n+1;
  pFKey->nCol = nCol;
  if( pFromCol==0 ){
    pFKey->aCol[0].iFrom = p->nCol-1;
  }else{
    for(i=0; i<nCol; i++){
      int j;
      for(j=0; j<p->nCol; j++){
        if( sqlite3StrICmp(p->aCol[j].zName, pFromCol->a[i].zName)==0 ){
          pFKey->aCol[i].iFrom = j;
          break;
        }
      }
      if( j>=p->nCol ){
        sqlite3ErrorMsg(pParse, 
          "unknown column \"%s\" in foreign key definition", 
          pFromCol->a[i].zName);
        goto fk_end;
      }
    }
  }
  if( pToCol ){
    for(i=0; i<nCol; i++){
      int n = sqlite3Strlen30(pToCol->a[i].zName);
      pFKey->aCol[i].zCol = z;
      memcpy(z, pToCol->a[i].zName, n);
      z[n] = 0;
      z += n+1;
    }
  }
  pFKey->isDeferred = 0;
  pFKey->aAction[0] = (u8)(flags & 0xff);            /* ON DELETE action */
  pFKey->aAction[1] = (u8)((flags >> 8 ) & 0xff);    /* ON UPDATE action */

  assert( sqlite3SchemaMutexHeld(db, 0, p->pSchema) );
  pNextTo = (FKey *)sqlite3HashInsert(&p->pSchema->fkeyHash, 
      pFKey->zTo, (void *)pFKey
  );
  if( pNextTo==pFKey ){
    db->mallocFailed = 1;
    goto fk_end;
  }
  if( pNextTo ){
    assert( pNextTo->pPrevTo==0 );
    pFKey->pNextTo = pNextTo;
    pNextTo->pPrevTo = pFKey;
  }

  /* Link the foreign key to the table as the last step.
  */
  p->pFKey = pFKey;
  pFKey = 0;

fk_end:
  sqlite3DbFree(db, pFKey);
#endif /* !defined(SQLITE_OMIT_FOREIGN_KEY) */
  sqlite3ExprListDelete(db, pFromCol);
  sqlite3ExprListDelete(db, pToCol);
}